

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O3

int rsa1_load_f(Filename *filename,RSAKey *key,char *passphrase,char **errstr)

{
  int iVar1;
  LoadedFile *lf;
  
  lf = lf_load_keyfile(filename,errstr);
  if (lf == (LoadedFile *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = rsa1_load_s_internal(lf->binarysource_,key,false,(char **)0x0,passphrase,errstr);
    lf_free(lf);
  }
  return iVar1;
}

Assistant:

int rsa1_load_f(const Filename *filename, RSAKey *key,
                const char *passphrase, const char **errstr)
{
    LoadedFile *lf = lf_load_keyfile(filename, errstr);
    if (!lf)
        return false;

    int toret = rsa1_load_s(BinarySource_UPCAST(lf), key, passphrase, errstr);
    lf_free(lf);
    return toret;
}